

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NeuralNetworkClassifier::MergeFrom
          (NeuralNetworkClassifier *this,NeuralNetworkClassifier *from)

{
  ulong uVar1;
  LogMessage *other;
  NetworkUpdateParameters *pNVar2;
  StringVector *pSVar3;
  Int64Vector *pIVar4;
  undefined8 *puVar5;
  ulong uVar6;
  undefined1 *puVar7;
  Arena *pAVar8;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xe20f);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
            (&(this->layers_).super_RepeatedPtrFieldBase,&(from->layers_).super_RepeatedPtrFieldBase
            );
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::TypeHandler>
            (&(this->preprocessing_).super_RepeatedPtrFieldBase,
             &(from->preprocessing_).super_RepeatedPtrFieldBase);
  uVar6 = (ulong)(from->labelprobabilitylayername_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar6 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar5 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar5 = (undefined8 *)*puVar5;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->labelprobabilitylayername_,uVar6,puVar5);
  }
  if ((from != (NeuralNetworkClassifier *)_NeuralNetworkClassifier_default_instance_) &&
     (from->updateparams_ != (NetworkUpdateParameters *)0x0)) {
    if (this->updateparams_ == (NetworkUpdateParameters *)0x0) {
      uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar8 = (Arena *)(uVar6 & 0xfffffffffffffffc);
      if ((uVar6 & 1) != 0) {
        pAVar8 = *(Arena **)pAVar8;
      }
      pNVar2 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::NetworkUpdateParameters>(pAVar8);
      this->updateparams_ = pNVar2;
    }
    puVar7 = (undefined1 *)from->updateparams_;
    if ((NetworkUpdateParameters *)puVar7 == (NetworkUpdateParameters *)0x0) {
      puVar7 = _NetworkUpdateParameters_default_instance_;
    }
    NetworkUpdateParameters::MergeFrom(this->updateparams_,(NetworkUpdateParameters *)puVar7);
  }
  if (from->arrayinputshapemapping_ != 0) {
    this->arrayinputshapemapping_ = from->arrayinputshapemapping_;
  }
  if (from->imageinputshapemapping_ != 0) {
    this->imageinputshapemapping_ = from->imageinputshapemapping_;
  }
  if (from->_oneof_case_[0] == 0x65) {
    if (this->_oneof_case_[0] != 0x65) {
      clear_ClassLabels(this);
      this->_oneof_case_[0] = 0x65;
      uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar8 = (Arena *)(uVar6 & 0xfffffffffffffffc);
      if ((uVar6 & 1) != 0) {
        pAVar8 = *(Arena **)pAVar8;
      }
      pIVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                         (pAVar8);
      (this->ClassLabels_).int64classlabels_ = pIVar4;
    }
    if (from->_oneof_case_[0] == 0x65) {
      puVar7 = (undefined1 *)(from->ClassLabels_).int64classlabels_;
    }
    else {
      puVar7 = _Int64Vector_default_instance_;
    }
    Int64Vector::MergeFrom((this->ClassLabels_).int64classlabels_,(Int64Vector *)puVar7);
  }
  else if (from->_oneof_case_[0] == 100) {
    if (this->_oneof_case_[0] != 100) {
      clear_ClassLabels(this);
      this->_oneof_case_[0] = 100;
      uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar8 = (Arena *)(uVar6 & 0xfffffffffffffffc);
      if ((uVar6 & 1) != 0) {
        pAVar8 = *(Arena **)pAVar8;
      }
      pSVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                         (pAVar8);
      (this->ClassLabels_).stringclasslabels_ = pSVar3;
    }
    if (from->_oneof_case_[0] == 100) {
      puVar7 = (undefined1 *)(from->ClassLabels_).stringclasslabels_;
    }
    else {
      puVar7 = _StringVector_default_instance_;
    }
    StringVector::MergeFrom((this->ClassLabels_).stringclasslabels_,(StringVector *)puVar7);
  }
  uVar6 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar6 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void NeuralNetworkClassifier::MergeFrom(const NeuralNetworkClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NeuralNetworkClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  layers_.MergeFrom(from.layers_);
  preprocessing_.MergeFrom(from.preprocessing_);
  if (!from._internal_labelprobabilitylayername().empty()) {
    _internal_set_labelprobabilitylayername(from._internal_labelprobabilitylayername());
  }
  if (from._internal_has_updateparams()) {
    _internal_mutable_updateparams()->::CoreML::Specification::NetworkUpdateParameters::MergeFrom(from._internal_updateparams());
  }
  if (from._internal_arrayinputshapemapping() != 0) {
    _internal_set_arrayinputshapemapping(from._internal_arrayinputshapemapping());
  }
  if (from._internal_imageinputshapemapping() != 0) {
    _internal_set_imageinputshapemapping(from._internal_imageinputshapemapping());
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      _internal_mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      _internal_mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}